

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

vector<float,_pstd::pmr::polymorphic_allocator<float>_> * GetFloatPixels(Point2i res,int nc)

{
  int *piVar1;
  int in_EDX;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  double dVar2;
  int c;
  int x;
  int y;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *p;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  float *in_stack_ffffffffffffff58;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffff60;
  int local_3c;
  int local_38;
  int local_24;
  polymorphic_allocator<float> local_20;
  undefined1 local_15;
  int local_14;
  Tuple2<pbrt::Point2,_int> local_10 [2];
  
  local_15 = 0;
  local_14 = in_EDX;
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector(in_RDI,&local_20);
  for (local_24 = 0; piVar1 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1),
      local_24 < *piVar1; local_24 = local_24 + 1) {
    for (local_38 = 0; piVar1 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0),
        local_38 < *piVar1; local_38 = local_38 + 1) {
      for (local_3c = 0; local_3c < local_14; local_3c = local_3c + 1) {
        if (local_3c == 0) {
          sin((double)local_38 * 0.25);
          cos((double)local_24 * 0.125);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        else {
          piVar1 = pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
          dVar2 = (double)(local_3c + local_38 * 3 + local_24 * 3 * *piVar1);
          in_stack_ffffffffffffff60 =
               (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(dVar2 + dVar2);
          pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,0);
          in_stack_ffffffffffffff58 =
               (float *)pbrt::Tuple2<pbrt::Point2,_int>::operator[](local_10,1);
          pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::push_back
                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

static pstd::vector<float> GetFloatPixels(Point2i res, int nc) {
    pstd::vector<float> p;
    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            for (int c = 0; c < nc; ++c)
                if (c == 0)
                    p.push_back(std::sin(x / 4.) * std::cos(y / 8.));
                else
                    p.push_back(-.25 +
                                2. * (c + 3 * x + 3 * y * res[0]) / (res[0] * res[1]));
    return p;
}